

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ArrayNewFixed *curr)

{
  Literal *pLVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  Literal local_100;
  uintptr_t local_e8;
  HeapType heapType;
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  
  uVar4 = *(ulong *)(curr + 0x18);
  uVar5 = (uint)uVar4;
  if (0x2aaaaa9 < uVar5) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  if (*(long *)(curr + 8) == 1) {
    uVar4 = *(ulong *)(curr + 0x18);
    if (uVar4 != 0) {
      uVar2 = 0;
      do {
        if (*(ulong *)(curr + 0x18) <= uVar2) goto LAB_00138387;
        visit(__return_storage_ptr__,this,*(Expression **)(*(long *)(curr + 0x10) + uVar2 * 8));
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
          return __return_storage_ptr__;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        wasm::Literal::~Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    wasm::handle_unreachable
              ("unreachable but no unreachable child",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x778);
  }
  uVar4 = uVar4 & 0xffffffff;
  local_e8 = (uintptr_t)Type::getHeapType((Type *)(curr + 8));
  wasm::HeapType::getArray();
  SmallVector<wasm::Literal,_1UL>::SmallVector((SmallVector<wasm::Literal,_1UL> *)local_b8,uVar4);
  if (uVar5 != 0) {
    lVar3 = -0x18;
    uVar2 = 0;
    do {
      if (*(ulong *)(curr + 0x18) <= uVar2) {
LAB_00138387:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,this,*(Expression **)(*(long *)(curr + 0x10) + uVar2 * 8));
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_00138359;
      pLVar1 = Flow::getSingleValue(__return_storage_ptr__);
      wasm::Literal::Literal(&local_d0,pLVar1);
      truncateForPacking(&local_100,this,&local_d0,(Field *)&heapType);
      pLVar1 = (Literal *)
               (data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar3);
      if (uVar2 == 0) {
        pLVar1 = (Literal *)&data;
      }
      wasm::Literal::operator=(pLVar1,&local_100);
      wasm::Literal::~Literal(&local_100);
      wasm::Literal::~Literal(&local_d0);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 != uVar2);
  }
  makeGCData((Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(Literals *)local_b8,
             (Type)*(uintptr_t *)(curr + 8));
  Flow::Flow(__return_storage_ptr__,
             (Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  wasm::Literal::~Literal
            ((Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_00138359:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&data);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return makeGCData(std::move(data), curr->type);
  }